

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_examples.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/FSMaxB[P]cJSON/tests/parse_examples.c"
            );
  UnityDefaultTestRun(file_test1_should_be_parsed_and_printed,
                      "file_test1_should_be_parsed_and_printed",0xc9);
  UnityDefaultTestRun(file_test2_should_be_parsed_and_printed,
                      "file_test2_should_be_parsed_and_printed",0xca);
  UnityDefaultTestRun(file_test3_should_be_parsed_and_printed,
                      "file_test3_should_be_parsed_and_printed",0xcb);
  UnityDefaultTestRun(file_test4_should_be_parsed_and_printed,
                      "file_test4_should_be_parsed_and_printed",0xcc);
  UnityDefaultTestRun(file_test5_should_be_parsed_and_printed,
                      "file_test5_should_be_parsed_and_printed",0xcd);
  UnityDefaultTestRun(file_test6_should_not_be_parsed,"file_test6_should_not_be_parsed",0xce);
  UnityDefaultTestRun(file_test7_should_be_parsed_and_printed,
                      "file_test7_should_be_parsed_and_printed",0xcf);
  UnityDefaultTestRun(file_test8_should_be_parsed_and_printed,
                      "file_test8_should_be_parsed_and_printed",0xd0);
  UnityDefaultTestRun(file_test9_should_be_parsed_and_printed,
                      "file_test9_should_be_parsed_and_printed",0xd1);
  UnityDefaultTestRun(file_test10_should_be_parsed_and_printed,
                      "file_test10_should_be_parsed_and_printed",0xd2);
  UnityDefaultTestRun(file_test11_should_be_parsed_and_printed,
                      "file_test11_should_be_parsed_and_printed",0xd3);
  UnityDefaultTestRun(test12_should_not_be_parsed,"test12_should_not_be_parsed",0xd4);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    UNITY_BEGIN();
    RUN_TEST(file_test1_should_be_parsed_and_printed);
    RUN_TEST(file_test2_should_be_parsed_and_printed);
    RUN_TEST(file_test3_should_be_parsed_and_printed);
    RUN_TEST(file_test4_should_be_parsed_and_printed);
    RUN_TEST(file_test5_should_be_parsed_and_printed);
    RUN_TEST(file_test6_should_not_be_parsed);
    RUN_TEST(file_test7_should_be_parsed_and_printed);
    RUN_TEST(file_test8_should_be_parsed_and_printed);
    RUN_TEST(file_test9_should_be_parsed_and_printed);
    RUN_TEST(file_test10_should_be_parsed_and_printed);
    RUN_TEST(file_test11_should_be_parsed_and_printed);
    RUN_TEST(test12_should_not_be_parsed);
    return UNITY_END();
}